

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<QLayoutStruct>::data(QList<QLayoutStruct> *this)

{
  QArrayDataPointer<QLayoutStruct> *this_00;
  QLayoutStruct *pQVar1;
  QArrayDataPointer<QLayoutStruct> *in_RDI;
  
  detach((QList<QLayoutStruct> *)0x2f984c);
  this_00 = (QArrayDataPointer<QLayoutStruct> *)QArrayDataPointer<QLayoutStruct>::operator->(in_RDI)
  ;
  pQVar1 = QArrayDataPointer<QLayoutStruct>::data(this_00);
  return pQVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }